

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void deque_int(void)

{
  initializer_list<int> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  Assert local_1f8;
  deque<int,_std::allocator<int>_> s;
  stringstream ss;
  ostream local_188 [384];
  
  _ss = 0x100000000;
  __l._M_len = 4;
  __l._M_array = (iterator)&ss;
  std::deque<int,_std::allocator<int>_>::deque(&s,__l,(allocator_type *)&local_218);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_218._M_dataplus._M_p = (pointer)&s;
  UnitTests::stream_any_details::operator<<
            (local_188,(outputter<std::deque<int,_std::allocator<int>_>_> *)&local_218);
  local_1f8.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1f8.m_line = 0x7a;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1f8,(char (*) [15])"[0, 1, 2, 156]",&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&s.super__Deque_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(deque_int)
{
    auto s  = std::deque<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}